

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

CoinsList * __thiscall
wallet::anon_unknown_5::WalletImpl::listCoins(CoinsList *__return_storage_ptr__,WalletImpl *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  CWallet *this_00;
  vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
  *this_01;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  unique_lock<std::recursive_mutex> local_b0;
  WalletTxOut local_a0;
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ListCoins((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             *)&local_68,
            (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  p_Var3 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_68._M_impl.super__Rb_tree_header) {
    do {
      this_01 = (vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
                 *)_GLOBAL__N_1::std::
                   map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<std::tuple<COutPoint,_interfaces::WalletTxOut>,_std::allocator<std::tuple<COutPoint,_interfaces::WalletTxOut>_>_>_>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 1));
      p_Var2 = p_Var3[3]._M_right;
      for (p_Var4 = p_Var3[3]._M_left; p_Var4 != p_Var2; p_Var4 = p_Var4 + 5) {
        this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        CTxOut::CTxOut(&local_a0.txout);
        local_a0.depth_in_main_chain = -1;
        local_a0.is_spent = false;
        local_a0.txout.nValue = (CAmount)p_Var4[2]._M_parent;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&local_a0.txout.scriptPubKey.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p_Var4[2]._M_left);
        local_a0.time = *(int64_t *)(p_Var4 + 4);
        local_a0.depth_in_main_chain = *(int *)&p_Var4[3]._M_left;
        local_a0.is_spent = CWallet::IsSpent(this_00,(COutPoint *)(p_Var4 + 1));
        std::
        vector<std::tuple<COutPoint,interfaces::WalletTxOut>,std::allocator<std::tuple<COutPoint,interfaces::WalletTxOut>>>
        ::emplace_back<COutPoint_const&,interfaces::WalletTxOut>
                  (this_01,(COutPoint *)(p_Var4 + 1),&local_a0);
        if (0x1c < local_a0.txout.scriptPubKey.super_CScriptBase._size) {
          free(local_a0.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_68._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree(&local_68);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CoinsList listCoins() override
    {
        LOCK(m_wallet->cs_wallet);
        CoinsList result;
        for (const auto& entry : ListCoins(*m_wallet)) {
            auto& group = result[entry.first];
            for (const auto& coin : entry.second) {
                group.emplace_back(coin.outpoint,
                    MakeWalletTxOut(*m_wallet, coin));
            }
        }
        return result;
    }